

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

Descriptor *
cfd::core::Descriptor::CreateDescriptor
          (Descriptor *__return_storage_ptr__,
          vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
          *type_list,
          vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
          *key_info_list,uint32_t require_num,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  DescriptorScriptType DVar3;
  pointer pDVar4;
  pointer pDVar5;
  Descriptor *pDVar6;
  char cVar7;
  char cVar8;
  DescriptorNodeScriptData *node_data;
  undefined8 *puVar9;
  long *plVar10;
  CfdException *pCVar11;
  uint32_t uVar12;
  long lVar13;
  size_type *psVar14;
  long *plVar15;
  pointer this;
  undefined8 uVar16;
  ulong uVar17;
  _Alloc_hider _Var18;
  bool bVar19;
  string output_descriptor;
  string key_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_> types;
  undefined1 local_170 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  string local_110;
  uint32_t local_ec;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  pointer local_c8;
  ulong *local_c0;
  uint local_b8;
  undefined4 uStack_b4;
  ulong local_b0 [2];
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  long *local_80;
  undefined8 local_78;
  long local_70;
  undefined8 uStack_68;
  vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_> *local_60;
  vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_> local_58
  ;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_40;
  Descriptor *local_38;
  
  local_ec = require_num;
  local_60 = key_info_list;
  if ((type_list->
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (type_list->
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_150._0_8_ = "cfdcore_descriptor.cpp";
    local_150._8_4_ = 0x83d;
    local_140._M_allocated_capacity = 0x6e3786;
    logger::log<>((CfdSourceLocation *)local_150,kCfdLogLevelWarning,"Failed to type list.");
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    local_150._0_8_ = &local_140;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"Failed to type list. list is empty.","");
    CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_150);
    __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_150._0_8_ = &local_140;
  local_150._8_8_ = 0;
  local_140._M_allocated_capacity = local_140._M_allocated_capacity & 0xffffffffffffff00;
  local_40 = network_parameters;
  local_38 = __return_storage_ptr__;
  ::std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>::
  vector(&local_58,type_list);
  if (local_58.
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_58.
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar2 = &local_110.field_2;
    do {
      local_130 = &local_120;
      DVar3 = local_58.
              super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1];
      local_128 = 0;
      local_120 = 0;
      local_c8 = local_58.
                 super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_150._8_8_ == 0) {
        pDVar4 = (local_60->
                 super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (this = (local_60->
                    super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start; this != pDVar4; this = this + 1) {
          if (local_128 == 0) {
            DescriptorKeyInfo::ToString_abi_cxx11_((string *)local_170,this);
            ::std::__cxx11::string::operator=((string *)&local_130,(string *)local_170);
            uVar16 = local_160._M_allocated_capacity;
            _Var18._M_p = (pointer)local_170._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._0_8_ != &local_160) goto LAB_0045d587;
          }
          else {
            DescriptorKeyInfo::ToString_abi_cxx11_(&local_110,this);
            plVar10 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_110,0,(char *)0x0,0x6e3784);
            local_170._0_8_ = &local_160;
            psVar14 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_160._M_allocated_capacity = *psVar14;
              local_160._8_8_ = plVar10[3];
            }
            else {
              local_160._M_allocated_capacity = *psVar14;
              local_170._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar10;
            }
            local_170._8_8_ = plVar10[1];
            *plVar10 = (long)psVar14;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)&local_130,local_170._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._0_8_ != &local_160) {
              operator_delete((void *)local_170._0_8_,local_160._M_allocated_capacity + 1);
            }
            uVar16 = local_110.field_2._M_allocated_capacity;
            _Var18._M_p = local_110._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != paVar2) {
LAB_0045d587:
              operator_delete(_Var18._M_p,uVar16 + 1);
            }
          }
        }
      }
      local_c8 = local_c8 + -1;
      lVar13 = 0;
      do {
        plVar10 = (long *)((long)&kDescriptorNodeScriptTable + lVar13);
        if (DVar3 == *(DescriptorScriptType *)((long)&DAT_00827030 + lVar13)) break;
        bVar19 = lVar13 != 400;
        lVar13 = lVar13 + 0x28;
        plVar10 = (long *)0x0;
      } while (bVar19);
      if (DVar3 - kDescriptorScriptPk < 6) {
        if (local_150._8_8_ != 0) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x861;
          local_160._M_allocated_capacity = 0x6e3786;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,
                        "key hash type is bottom only.");
          pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"Failed to createDescriptor. key hash type is bottom only."
                     ,"");
          CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (local_128 == 0) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x867;
          local_160._M_allocated_capacity = 0x6e3786;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,"key list is empty");
          pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"Failed to createDescriptor. key list is empty.","");
          CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (plVar10 == (long *)0x0) goto LAB_0045dbf7;
        if ((*(char *)((long)plVar10 + 0x26) == '\0') &&
           (1 < (ulong)(((long)(local_60->
                               super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_60->
                               super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 3) *
                       -0x34115b1e5f75270d))) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x86e;
          local_160._M_allocated_capacity = 0x6e3786;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,
                        "multiple key is multisig only.");
          pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,
                     "Failed to createDescriptor. multiple key is multisig only.","");
          CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
      else {
        if (1 < DVar3 - kDescriptorScriptSh) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x883;
          local_160._M_allocated_capacity = 0x6e3786;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,"Failed to script type.")
          ;
          pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"Failed to script type. this type is unsupported.","");
          CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (local_150._8_8_ == 0) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x877;
          local_160._M_allocated_capacity = 0x6e3786;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,
                        "Failed to script hash type.");
          pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,
                     "Failed to script hash type. this type is unsupported of key.","");
          CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
      if (plVar10 == (long *)0x0) {
LAB_0045dbf7:
        local_170._0_8_ = "cfdcore_descriptor.cpp";
        local_170._8_4_ = 0x88b;
        local_160._M_allocated_capacity = 0x6e3786;
        logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,"Failed to script type.");
        pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
        local_170._0_8_ = &local_160;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_170,"Failed to script type. this type is unsupported.","");
        CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_170);
        __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (local_128 == 0) {
        local_e8 = &local_d8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,*plVar10,plVar10[1] + *plVar10);
        ::std::__cxx11::string::append((char *)&local_e8);
        plVar10 = (long *)::std::__cxx11::string::_M_append((char *)&local_e8,local_150._0_8_);
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_110.field_2._M_allocated_capacity = *psVar14;
          local_110.field_2._8_8_ = plVar10[3];
          local_110._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar14;
          local_110._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_110._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
LAB_0045d7c7:
        psVar14 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_160._M_allocated_capacity = *psVar14;
          local_160._8_8_ = puVar9[3];
          local_170._0_8_ = &local_160;
        }
        else {
          local_160._M_allocated_capacity = *psVar14;
          local_170._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar9;
        }
        local_170._8_8_ = puVar9[1];
        *puVar9 = psVar14;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)local_150,(string *)local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._0_8_ != &local_160) {
          operator_delete((void *)local_170._0_8_,local_160._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != paVar2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        local_58.
        super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
        ._M_impl.super__Vector_impl_data._M_finish = local_c8;
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
          local_58.
          super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
          ._M_impl.super__Vector_impl_data._M_finish = local_c8;
        }
      }
      else {
        if (*(char *)((long)plVar10 + 0x26) != '\x01') {
          local_e8 = &local_d8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,*plVar10,plVar10[1] + *plVar10);
          ::std::__cxx11::string::append((char *)&local_e8);
          puVar9 = (undefined8 *)
                   ::std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_130);
          psVar14 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_110.field_2._M_allocated_capacity = *psVar14;
            local_110.field_2._8_8_ = puVar9[3];
            local_110._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_110.field_2._M_allocated_capacity = *psVar14;
            local_110._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_110._M_string_length = puVar9[1];
          *puVar9 = psVar14;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
          goto LAB_0045d7c7;
        }
        local_a0 = local_90;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,*plVar10,plVar10[1] + *plVar10);
        ::std::__cxx11::string::append((char *)&local_a0);
        cVar8 = '\x01';
        if (9 < local_ec) {
          uVar12 = local_ec;
          cVar7 = '\x04';
          do {
            cVar8 = cVar7;
            if (uVar12 < 100) {
              cVar8 = cVar8 + -2;
              goto LAB_0045d875;
            }
            if (uVar12 < 1000) {
              cVar8 = cVar8 + -1;
              goto LAB_0045d875;
            }
            if (uVar12 < 10000) goto LAB_0045d875;
            bVar19 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar7 = cVar8 + '\x04';
          } while (bVar19);
          cVar8 = cVar8 + '\x01';
        }
LAB_0045d875:
        local_c0 = local_b0;
        ::std::__cxx11::string::_M_construct((ulong)&local_c0,cVar8);
        ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c0,local_b8,local_ec);
        uVar17 = 0xf;
        if (local_a0 != local_90) {
          uVar17 = local_90[0];
        }
        uVar1 = CONCAT44(uStack_b4,local_b8) + local_98;
        if (uVar17 < uVar1) {
          uVar17 = 0xf;
          if (local_c0 != local_b0) {
            uVar17 = local_b0[0];
          }
          if (uVar17 < uVar1) goto LAB_0045d910;
          puVar9 = (undefined8 *)
                   ::std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
        }
        else {
LAB_0045d910:
          puVar9 = (undefined8 *)
                   ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0);
        }
        plVar10 = puVar9 + 2;
        if ((long *)*puVar9 == plVar10) {
          local_70 = *plVar10;
          uStack_68 = puVar9[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar10;
          local_80 = (long *)*puVar9;
        }
        local_78 = puVar9[1];
        *puVar9 = plVar10;
        puVar9[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)::std::__cxx11::string::append((char *)&local_80);
        plVar15 = plVar10 + 2;
        if ((long *)*plVar10 == plVar15) {
          local_d8 = *plVar15;
          lStack_d0 = plVar10[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar15;
          local_e8 = (long *)*plVar10;
        }
        local_e0 = plVar10[1];
        *plVar10 = (long)plVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar9 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_130)
        ;
        psVar14 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_110.field_2._M_allocated_capacity = *psVar14;
          local_110.field_2._8_8_ = puVar9[3];
          local_110._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar14;
          local_110._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_110._M_string_length = puVar9[1];
        *puVar9 = psVar14;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
        psVar14 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_160._M_allocated_capacity = *psVar14;
          local_160._8_8_ = puVar9[3];
          local_170._0_8_ = &local_160;
        }
        else {
          local_160._M_allocated_capacity = *psVar14;
          local_170._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar9;
        }
        local_170._8_8_ = puVar9[1];
        *puVar9 = psVar14;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)local_150,(string *)local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._0_8_ != &local_160) {
          operator_delete((void *)local_170._0_8_,local_160._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != paVar2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
        pDVar5 = local_c8;
        if (local_80 != &local_70) {
          operator_delete(local_80,local_70 + 1);
        }
        if (local_c0 != local_b0) {
          operator_delete(local_c0,local_b0[0] + 1);
        }
        local_58.
        super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar5;
        if (local_a0 != local_90) {
          operator_delete(local_a0,local_90[0] + 1);
        }
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
      }
    } while (local_58.
             super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             local_58.
             super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  pDVar6 = local_38;
  Parse(local_38,(string *)local_150,local_40,kMainnet);
  if (local_58.
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._0_8_ != &local_140) {
    operator_delete((void *)local_150._0_8_,local_140._M_allocated_capacity + 1);
  }
  return pDVar6;
}

Assistant:

Descriptor Descriptor::CreateDescriptor(
    const std::vector<DescriptorScriptType>& type_list,
    const std::vector<DescriptorKeyInfo>& key_info_list, uint32_t require_num,
    const std::vector<AddressFormatData>* network_parameters) {
  if (type_list.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to type list.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to type list. list is empty.");
  }
  std::string output_descriptor;
  std::vector<DescriptorScriptType> types(type_list);
  for (auto ite = types.rbegin(); ite != types.rend(); ++ite) {
    DescriptorScriptType type = *ite;

    std::string key_text;
    if (output_descriptor.empty() && (!key_info_list.empty())) {
      for (const auto& key_info : key_info_list) {
        if (key_text.empty()) {
          key_text = key_info.ToString();
        } else {
          key_text += "," + key_info.ToString();
        }
      }
    }

    const DescriptorNodeScriptData* p_data = nullptr;
    for (const auto& node_data : kDescriptorNodeScriptTable) {
      if (type == node_data.type) {
        p_data = &node_data;
        break;
      }
    }
    switch (type) {
      case DescriptorScriptType::kDescriptorScriptPk:
      case DescriptorScriptType::kDescriptorScriptPkh:
      case DescriptorScriptType::kDescriptorScriptWpkh:
      case DescriptorScriptType::kDescriptorScriptCombo:
      case DescriptorScriptType::kDescriptorScriptMulti:
      case DescriptorScriptType::kDescriptorScriptSortedMulti:
        if (!output_descriptor.empty()) {
          warn(CFD_LOG_SOURCE, "key hash type is bottom only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. key hash type is bottom only.");
        }
        if (key_text.empty()) {
          warn(CFD_LOG_SOURCE, "key list is empty");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. key list is empty.");
        }
        if ((p_data != nullptr) && (!p_data->multisig) &&
            (key_info_list.size() > 1)) {
          warn(CFD_LOG_SOURCE, "multiple key is multisig only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. multiple key is multisig only.");
        }
        break;
      case DescriptorScriptType::kDescriptorScriptSh:
      case DescriptorScriptType::kDescriptorScriptWsh:
        if (output_descriptor.empty()) {
          warn(CFD_LOG_SOURCE, "Failed to script hash type.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to script hash type. this type is unsupported of key.");
        }
        break;
      case DescriptorScriptType::kDescriptorScriptTaproot:
        // fall-through: unsupported yet.
      case DescriptorScriptType::kDescriptorScriptNull:
      case DescriptorScriptType::kDescriptorScriptAddr:
      case DescriptorScriptType::kDescriptorScriptRaw:
      default:
        warn(CFD_LOG_SOURCE, "Failed to script type.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to script type. this type is unsupported.");
        break;
    }

    if (p_data == nullptr) {
      warn(CFD_LOG_SOURCE, "Failed to script type.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to script type. this type is unsupported.");
    } else if (key_text.empty()) {
      output_descriptor = p_data->name + "(" + output_descriptor + ")";
    } else if (p_data->multisig) {
      output_descriptor = p_data->name + "(" + std::to_string(require_num) +
                          "," + key_text + ")";
    } else {
      output_descriptor = p_data->name + "(" + key_text + ")";
    }
  }

  // Check descriptor script format.
  return Parse(output_descriptor, network_parameters);
}